

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::write<(moira::Core)0,(moira::AddrSpace)1,2,4ull>(Moira *this,u32 addr,u32 val)

{
  StackFrame frame;
  u32 uVar1;
  bool bVar2;
  u32 uVar3;
  AddressError *this_00;
  StackFrame local_30;
  u32 local_18;
  u32 local_14;
  u32 val_local;
  u32 addr_local;
  Moira *this_local;
  
  local_18 = val;
  local_14 = addr;
  _val_local = this;
  setFC(this,'\x01');
  bVar2 = misaligned<(moira::Core)0,2>(this,local_14);
  if (bVar2) {
    this_00 = (AddressError *)__cxa_allocate_exception(0x20);
    makeFrame<12ull>(&local_30,this,local_14);
    frame.ird = local_30.ird;
    frame.sr = local_30.sr;
    frame.pc = local_30.pc;
    frame.code = local_30.code;
    frame._2_2_ = local_30._2_2_;
    frame.addr = local_30.addr;
    frame.fc = local_30.fc;
    frame.ssw = local_30.ssw;
    AddressError::AddressError(this_00,frame);
    __cxa_throw(this_00,&AddressError::typeinfo,AddressError::~AddressError);
  }
  if (((this->flags & 0x100U) != 0) &&
     (bVar2 = Debugger::watchpointMatches(&this->debugger,local_14,2), bVar2)) {
    (*this->_vptr_Moira[0x16])(this,(ulong)local_14);
  }
  uVar1 = local_14;
  (this->reg).ipl = this->ipl;
  uVar3 = addrMask<(moira::Core)0>(this);
  (*this->_vptr_Moira[8])(this,(ulong)(uVar1 & uVar3),(ulong)(ushort)local_18);
  return;
}

Assistant:

void
Moira::write(u32 addr, u32 val)
{
    // Update function code pins
    setFC(AS == AddrSpace::DATA ? FC::USER_DATA : FC::USER_PROG);
    SYNC(2);

    // Check for address errors
    if (misaligned<C, S>(addr)) {
        throw AddressError(makeFrame<F|AE_WRITE>(addr));
    }

    // Check if a watchpoint has been reached
    if ((flags & State::CHECK_WP) && debugger.watchpointMatches(addr, S)) {
        didReachWatchpoint(addr);
    }

    if constexpr (S == Byte) {

        if (F & POLL) POLL_IPL;
        write8(addr & addrMask<C>(), (u8)val);
        SYNC(2);
    }

    if constexpr (S == Word) {

        if (F & POLL) POLL_IPL;
        write16(addr & addrMask<C>(), (u16)val);
        SYNC(2);
    }

    if constexpr (S == Long) {

        if (F & REVERSE) {

            write16((addr + 2) & addrMask<C>(), u16(val & 0xFFFF));
            SYNC(4);
            if (F & POLL) POLL_IPL;
            write16(addr & addrMask<C>(), u16(val >> 16));
            SYNC(2);

        } else {

            write16(addr & addrMask<C>(), u16(val >> 16));
            SYNC(4);
            if (F & POLL) POLL_IPL;
            write16((addr + 2) & addrMask<C>(), u16(val & 0xFFFF));
            SYNC(2);
        }
    }
}